

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::ImageDataParameter::SerializeWithCachedSizes
          (ImageDataParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  string *psVar2;
  void *pvVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.source");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->source_).ptr_,output);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,this->scale_,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->mean_file_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.mean_file");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (3,(this->mean_file_).ptr_,output);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,this->batch_size_,output);
  }
  if ((uVar1 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,this->crop_size_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(6,this->mirror_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(7,this->rand_skip_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(8,this->shuffle_,output);
  }
  if ((char)uVar1 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteUInt32(9,this->new_height_,output);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,this->new_width_,output);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0xb,this->is_color_,output);
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->root_folder_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.root_folder");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xc,(this->root_folder_).ptr_,output);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void ImageDataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.ImageDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->source(), output);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scale(), output);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.mean_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->mean_file(), output);
  }

  // optional uint32 batch_size = 4 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(4, this->batch_size(), output);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(5, this->crop_size(), output);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->mirror(), output);
  }

  // optional uint32 rand_skip = 7 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(7, this->rand_skip(), output);
  }

  // optional bool shuffle = 8 [default = false];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(8, this->shuffle(), output);
  }

  // optional uint32 new_height = 9 [default = 0];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(9, this->new_height(), output);
  }

  // optional uint32 new_width = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->new_width(), output);
  }

  // optional bool is_color = 11 [default = true];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(11, this->is_color(), output);
  }

  // optional string root_folder = 12 [default = ""];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.root_folder");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->root_folder(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.ImageDataParameter)
}